

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall
glslang::TType::deepCopy
          (TType *this,TType *copyOf,
          TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
          *copiedMap)

{
  anon_union_8_2_8ac53c11_for_TType_13 *__k;
  _Rb_tree_header *p_Var1;
  TSourceLoc *pTVar2;
  TSpirvDecorate *__x;
  TSpirvType *pTVar3;
  TArraySizes *pTVar4;
  TTypeList *pTVar5;
  iterator __position;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  TPoolAllocator *pTVar9;
  TSpirvDecorate *this_00;
  TSpirvType *pTVar10;
  TArraySizes *pTVar11;
  TTypeParameters *pTVar12;
  mapped_type pTVar13;
  mapped_type *ppTVar14;
  pointer pTVar15;
  TType *pTVar16;
  TString *pTVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  ulong uVar20;
  ulong uVar21;
  TTypeLoc typeLoc;
  TTypeLoc local_50;
  
  shallowCopy(this,copyOf);
  if ((copyOf->qualifier).spirvDecorate != (TSpirvDecorate *)0x0) {
    pTVar9 = GetThreadPoolAllocator();
    this_00 = (TSpirvDecorate *)TPoolAllocator::allocate(pTVar9,0xa8);
    pTVar9 = GetThreadPoolAllocator();
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Node_allocator).allocator
         = pTVar9;
    p_Var1 = &((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header;
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header)._M_header.
    _M_color = _S_red;
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header)._M_header.
    _M_parent = (_Base_ptr)0x0;
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header)._M_header.
    _M_left = &p_Var1->_M_header;
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header)._M_header.
    _M_right = &p_Var1->_M_header;
    (((_Rb_tree_impl<std::less<int>,_true> *)&this_00->decorates)->super__Rb_tree_header).
    _M_node_count = 0;
    pTVar9 = GetThreadPoolAllocator();
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar9;
    p_Var1 = &(this_00->decorateIds).
              super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this_00->decorateIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pTVar9 = GetThreadPoolAllocator();
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar9;
    p_Var1 = &(this_00->decorateStrings).
              super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this_00->decorateStrings).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->qualifier).spirvDecorate = this_00;
    __x = (copyOf->qualifier).spirvDecorate;
    std::
    _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 *)this_00,
                (_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 *)__x);
    std::
    _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 *)&this_00->decorateIds,
                (_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 *)&__x->decorateIds);
    std::
    _Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 *)&this_00->decorateStrings,
                (_Rb_tree<int,_std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>,_std::_Select1st<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 *)&__x->decorateStrings);
  }
  if (copyOf->spirvType != (TSpirvType *)0x0) {
    pTVar9 = GetThreadPoolAllocator();
    pTVar10 = (TSpirvType *)TPoolAllocator::allocate(pTVar9,0x50);
    TSpirvInstruction::TSpirvInstruction((TSpirvInstruction *)pTVar10);
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pTVar9 = GetThreadPoolAllocator();
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Tp_alloc_type.allocator = pTVar9;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar10->typeParams).
    super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    .
    super__Vector_base<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->spirvType = pTVar10;
    pTVar3 = copyOf->spirvType;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)pTVar10,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)pTVar3);
    (pTVar10->spirvInst).id = (pTVar3->spirvInst).id;
    std::
    vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>::
    operator=(&(pTVar10->typeParams).
               super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
              ,&(pTVar3->typeParams).
                super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             );
  }
  if (copyOf->arraySizes != (TArraySizes *)0x0) {
    pTVar9 = GetThreadPoolAllocator();
    pTVar11 = (TArraySizes *)TPoolAllocator::allocate(pTVar9,0x18);
    (pTVar11->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00af64d8;
    (pTVar11->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar11->implicitArraySize = 0;
    pTVar11->implicitlySized = true;
    pTVar11->variablyIndexed = false;
    this->arraySizes = pTVar11;
    pTVar4 = copyOf->arraySizes;
    pTVar11->implicitArraySize = pTVar4->implicitArraySize;
    pTVar11->variablyIndexed = pTVar4->variablyIndexed;
    TSmallArrayVector::operator=((TSmallArrayVector *)pTVar11,&pTVar4->sizes);
    pTVar11->implicitlySized = pTVar4->implicitlySized;
  }
  if (copyOf->typeParameters != (TTypeParameters *)0x0) {
    pTVar9 = GetThreadPoolAllocator();
    pTVar12 = (TTypeParameters *)TPoolAllocator::allocate(pTVar9,0x18);
    pTVar12->basicType = EbtVoid;
    pTVar12->arraySizes = (TArraySizes *)0x0;
    pTVar12->spirvType = (TSpirvType *)0x0;
    this->typeParameters = pTVar12;
    pTVar9 = GetThreadPoolAllocator();
    pTVar11 = (TArraySizes *)TPoolAllocator::allocate(pTVar9,0x18);
    (pTVar11->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_00af64d8;
    (pTVar11->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar11->implicitArraySize = 0;
    pTVar11->implicitlySized = true;
    pTVar11->variablyIndexed = false;
    this->typeParameters->arraySizes = pTVar11;
    pTVar4 = copyOf->typeParameters->arraySizes;
    pTVar11->implicitArraySize = pTVar4->implicitArraySize;
    pTVar11->variablyIndexed = pTVar4->variablyIndexed;
    TSmallArrayVector::operator=((TSmallArrayVector *)pTVar11,&pTVar4->sizes);
    pTVar11->implicitlySized = pTVar4->implicitlySized;
    pTVar3 = copyOf->typeParameters->spirvType;
    if (pTVar3 != (TSpirvType *)0x0) {
      pTVar10 = this->typeParameters->spirvType;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                pTVar10,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)pTVar3);
      (pTVar10->spirvInst).id = (pTVar3->spirvInst).id;
      std::
      vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>::
      operator=(&(pTVar10->typeParams).
                 super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
                ,&(pTVar3->typeParams).
                  super_vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
               );
    }
    this->typeParameters->basicType = (uint)(byte)copyOf->field_0x8;
  }
  iVar8 = (*copyOf->_vptr_TType[0x25])(copyOf);
  if (((char)iVar8 != '\0') && (pTVar5 = (copyOf->field_13).structure, pTVar5 != (TTypeList *)0x0))
  {
    p_Var19 = (copiedMap->
              super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
              )._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var19 != (_Base_ptr)0x0) {
      p_Var1 = &(copiedMap->
                super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                )._M_t._M_impl.super__Rb_tree_header;
      p_Var18 = &p_Var1->_M_header;
      do {
        if (*(TTypeList **)(p_Var19 + 1) >= pTVar5) {
          p_Var18 = p_Var19;
        }
        p_Var19 = (&p_Var19->_M_left)[*(TTypeList **)(p_Var19 + 1) < pTVar5];
      } while (p_Var19 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var18 != p_Var1) && (*(TTypeList **)(p_Var18 + 1) <= pTVar5)) {
        this->field_13 = (anon_union_8_2_8ac53c11_for_TType_13)p_Var18[1]._M_parent;
        goto LAB_003e2867;
      }
    }
    __k = &copyOf->field_13;
    pTVar9 = GetThreadPoolAllocator();
    pTVar13 = (mapped_type)TPoolAllocator::allocate(pTVar9,0x20);
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar9 = GetThreadPoolAllocator();
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Tp_alloc_type.allocator = pTVar9;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar13->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->field_13).structure = pTVar13;
    ppTVar14 = std::
               map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
               ::operator[](&copiedMap->
                             super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                            ,&__k->structure);
    *ppTVar14 = pTVar13;
    pTVar15 = (__k->structure->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((__k->structure->
        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar15) {
      uVar20 = 0;
      uVar21 = 1;
      do {
        local_50.loc.column = pTVar15[uVar20].loc.column;
        local_50.loc._20_4_ = *(undefined4 *)&pTVar15[uVar20].loc.field_0x14;
        pTVar2 = &pTVar15[uVar20].loc;
        local_50.loc.name = pTVar2->name;
        local_50.loc.string = pTVar2->string;
        local_50.loc.line = pTVar2->line;
        pTVar9 = GetThreadPoolAllocator();
        pTVar16 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
        TType(pTVar16,EbtVoid,EvqTemporary,1,0,0,false);
        local_50.type = pTVar16;
        deepCopy(pTVar16,(__k->structure->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar20].type,copiedMap);
        pTVar16 = (this->field_13).referentType;
        __position._M_current = (TTypeLoc *)(pTVar16->qualifier).semanticName;
        if (__position._M_current == *(TTypeLoc **)&(pTVar16->qualifier).field_0x8) {
          std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
          _M_realloc_insert<glslang::TTypeLoc_const&>
                    ((vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)pTVar16
                     ,__position,&local_50);
        }
        else {
          ((__position._M_current)->loc).string = local_50.loc.string;
          ((__position._M_current)->loc).line = local_50.loc.line;
          ((__position._M_current)->loc).column = local_50.loc.column;
          *(undefined4 *)&((__position._M_current)->loc).field_0x14 = local_50.loc._20_4_;
          (__position._M_current)->type = local_50.type;
          ((__position._M_current)->loc).name = local_50.loc.name;
          (pTVar16->qualifier).semanticName = (pTVar16->qualifier).semanticName + 0x20;
        }
        pTVar15 = *(pointer *)&__k->referentType->field_0x8;
        bVar7 = uVar21 < (ulong)((long)(__k->referentType->qualifier).semanticName - (long)pTVar15
                                >> 5);
        uVar20 = uVar21;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (bVar7);
    }
  }
LAB_003e2867:
  if (copyOf->fieldName != (TString *)0x0) {
    pcVar6 = (copyOf->fieldName->_M_dataplus)._M_p;
    pTVar9 = GetThreadPoolAllocator();
    pTVar17 = (TString *)TPoolAllocator::allocate(pTVar9,0x28);
    local_50.type = (TType *)GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pTVar17,
               pcVar6,(pool_allocator<char> *)&local_50);
    this->fieldName = pTVar17;
  }
  if (copyOf->typeName != (TString *)0x0) {
    pcVar6 = (copyOf->typeName->_M_dataplus)._M_p;
    pTVar9 = GetThreadPoolAllocator();
    pTVar17 = (TString *)TPoolAllocator::allocate(pTVar9,0x28);
    local_50.type = (TType *)GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)pTVar17,
               pcVar6,(pool_allocator<char> *)&local_50);
    this->typeName = pTVar17;
  }
  return;
}

Assistant:

void deepCopy(const TType& copyOf, TMap<TTypeList*,TTypeList*>& copiedMap)
    {
        shallowCopy(copyOf);

        // GL_EXT_spirv_intrinsics
        if (copyOf.qualifier.spirvDecorate) {
            qualifier.spirvDecorate = new TSpirvDecorate;
            *qualifier.spirvDecorate = *copyOf.qualifier.spirvDecorate;
        }

        if (copyOf.spirvType) {
            spirvType = new TSpirvType;
            *spirvType = *copyOf.spirvType;
        }

        if (copyOf.arraySizes) {
            arraySizes = new TArraySizes;
            *arraySizes = *copyOf.arraySizes;
        }

        if (copyOf.typeParameters) {
            typeParameters = new TTypeParameters;
            typeParameters->arraySizes = new TArraySizes;
            *typeParameters->arraySizes = *copyOf.typeParameters->arraySizes;
            if (copyOf.typeParameters->spirvType) {
                *typeParameters->spirvType = *copyOf.typeParameters->spirvType;
            }
            typeParameters->basicType = copyOf.basicType;
        }

        if (copyOf.isStruct() && copyOf.structure) {
            auto prevCopy = copiedMap.find(copyOf.structure);
            if (prevCopy != copiedMap.end())
                structure = prevCopy->second;
            else {
                structure = new TTypeList;
                copiedMap[copyOf.structure] = structure;
                for (unsigned int i = 0; i < copyOf.structure->size(); ++i) {
                    TTypeLoc typeLoc;
                    typeLoc.loc = (*copyOf.structure)[i].loc;
                    typeLoc.type = new TType();
                    typeLoc.type->deepCopy(*(*copyOf.structure)[i].type, copiedMap);
                    structure->push_back(typeLoc);
                }
            }
        }

        if (copyOf.fieldName)
            fieldName = NewPoolTString(copyOf.fieldName->c_str());
        if (copyOf.typeName)
            typeName = NewPoolTString(copyOf.typeName->c_str());
    }